

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O1

bool __thiscall duckdb::BatchedBufferedData::ShouldBlockBatch(BatchedBufferedData *this,idx_t batch)

{
  mutex *__mutex;
  ulong uVar1;
  ulong uVar2;
  atomic<unsigned_long> *paVar3;
  int iVar4;
  idx_t *piVar5;
  
  __mutex = &(this->super_BufferedData).glock;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 == 0) {
    paVar3 = &this->read_queue_byte_count;
    piVar5 = &this->read_queue_capacity;
    if (this->min_batch != batch) {
      piVar5 = &this->buffer_capacity;
      paVar3 = &this->buffer_byte_count;
    }
    uVar1 = (paVar3->super___atomic_base<unsigned_long>)._M_i;
    uVar2 = *piVar5;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return uVar2 <= uVar1;
  }
  ::std::__throw_system_error(iVar4);
}

Assistant:

bool BatchedBufferedData::ShouldBlockBatch(idx_t batch) {
	lock_guard<mutex> lock(glock);
	bool is_minimum = IsMinimumBatchIndex(lock, batch);
	if (is_minimum) {
		// If there is room in the read queue, we want to process the minimum batch
		return read_queue_byte_count >= ReadQueueCapacity();
	}
	return buffer_byte_count >= BufferCapacity();
}